

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall
cmLocalGenerator::AddColorDiagnosticsFlags(cmLocalGenerator *this,string *flags,string *lang)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  size_type sVar2;
  bool bVar3;
  char *extraout_RDX;
  string *option;
  _Alloc_hider _Var4;
  string_view value;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  cmValue diag;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  options;
  string colorFlagName;
  cmValue local_a0;
  string local_98;
  undefined8 local_78;
  char *local_70;
  string local_68;
  string local_48;
  
  this_00 = this->Makefile;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"CMAKE_COLOR_DIAGNOSTICS","");
  local_a0 = cmMakefile::GetDefinition(this_00,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  bVar3 = cmValue::IsSet(&local_a0);
  if (bVar3) {
    paVar1 = &local_48.field_2;
    local_48._M_string_length = 0;
    local_48.field_2._M_local_buf[0] = '\0';
    local_48._M_dataplus._M_p = (pointer)paVar1;
    if ((local_a0.Value == (string *)0x0) ||
       (value._M_str = extraout_RDX, value._M_len = (size_t)((local_a0.Value)->_M_dataplus)._M_p,
       bVar3 = cmValue::IsOn((cmValue *)(local_a0.Value)->_M_string_length,value), !bVar3)) {
      local_98.field_2._8_8_ = (lang->_M_dataplus)._M_p;
      local_98.field_2._M_allocated_capacity = lang->_M_string_length;
      local_98._M_dataplus._M_p = (pointer)0x6;
      local_98._M_string_length = 0x771402;
      local_78 = 0x26;
      local_70 = "_COMPILE_OPTIONS_COLOR_DIAGNOSTICS_OFF";
      views_00._M_len = 3;
      views_00._M_array = (iterator)&local_98;
      cmCatViews_abi_cxx11_(&local_68,views_00);
    }
    else {
      local_98.field_2._8_8_ = (lang->_M_dataplus)._M_p;
      local_98.field_2._M_allocated_capacity = lang->_M_string_length;
      local_98._M_dataplus._M_p = (pointer)0x6;
      local_98._M_string_length = 0x771402;
      local_78 = 0x22;
      local_70 = "_COMPILE_OPTIONS_COLOR_DIAGNOSTICS";
      views._M_len = 3;
      views._M_array = (iterator)&local_98;
      cmCatViews_abi_cxx11_(&local_68,views);
    }
    std::__cxx11::string::operator=((string *)&local_48,(string *)&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    local_98._M_dataplus._M_p = (pointer)0x0;
    local_98._M_string_length = 0;
    local_98.field_2._M_allocated_capacity = 0;
    cmMakefile::GetDefExpandList
              (this->Makefile,&local_48,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_98,false);
    sVar2 = local_98._M_string_length;
    for (_Var4._M_p = local_98._M_dataplus._M_p; _Var4._M_p != (pointer)sVar2;
        _Var4._M_p = _Var4._M_p + 0x20) {
      (*this->_vptr_cmLocalGenerator[8])(this,flags,_Var4._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,
                      CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                               local_48.field_2._M_local_buf[0]) + 1);
    }
    return;
  }
  return;
}

Assistant:

void cmLocalGenerator::AddColorDiagnosticsFlags(std::string& flags,
                                                const std::string& lang)
{
  cmValue diag = this->Makefile->GetDefinition("CMAKE_COLOR_DIAGNOSTICS");
  if (diag.IsSet()) {
    std::string colorFlagName;
    if (diag.IsOn()) {
      colorFlagName =
        cmStrCat("CMAKE_", lang, "_COMPILE_OPTIONS_COLOR_DIAGNOSTICS");
    } else {
      colorFlagName =
        cmStrCat("CMAKE_", lang, "_COMPILE_OPTIONS_COLOR_DIAGNOSTICS_OFF");
    }

    std::vector<std::string> options;
    this->Makefile->GetDefExpandList(colorFlagName, options);

    for (std::string const& option : options) {
      this->AppendFlagEscape(flags, option);
    }
  }
}